

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

void __thiscall cmCTestSVN::ExternalParser::DoPath(ExternalParser *this,string *path)

{
  ulong __n;
  int iVar1;
  string local_path;
  string local_38 [32];
  
  local_path._M_dataplus._M_p = (pointer)&local_path.field_2;
  local_path._M_string_length = 0;
  local_path.field_2._M_local_buf[0] = '\0';
  __n = (this->SVN->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_string_length;
  if (__n < path->_M_string_length) {
    iVar1 = strncmp((path->_M_dataplus)._M_p,
                    (this->SVN->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus.
                    _M_p,__n);
    if (iVar1 == 0) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)path);
      std::__cxx11::string::operator=((string *)&local_path,local_38);
      std::__cxx11::string::~string(local_38);
      goto LAB_00273d30;
    }
  }
  std::__cxx11::string::_M_assign((string *)&local_path);
LAB_00273d30:
  std::__cxx11::list<cmCTestSVN::SVNInfo,std::allocator<cmCTestSVN::SVNInfo>>::
  emplace_back<std::__cxx11::string&>
            ((list<cmCTestSVN::SVNInfo,std::allocator<cmCTestSVN::SVNInfo>> *)
             &this->SVN->Repositories,&local_path);
  std::__cxx11::string::~string((string *)&local_path);
  return;
}

Assistant:

void DoPath(std::string const& path)
  {
    // Get local path relative to the source directory
    std::string local_path;
    if (path.size() > this->SVN->SourceDirectory.size() &&
        strncmp(path.c_str(), this->SVN->SourceDirectory.c_str(),
                this->SVN->SourceDirectory.size()) == 0) {
      local_path = path.substr(this->SVN->SourceDirectory.size() + 1);
    } else {
      local_path = path;
    }
    this->SVN->Repositories.emplace_back(local_path);
  }